

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O3

void duckdb_hll::sdsupdatelen(sds s)

{
  size_t sVar1;
  
  sVar1 = strlen(s);
  switch(s[-1] & 7) {
  case 0:
    s[-1] = (char)sVar1 << 3;
    break;
  case 1:
    s[-4] = (char)sVar1;
    break;
  case 2:
    *(short *)(s + -6) = (short)sVar1;
    break;
  case 3:
    *(int *)(s + -10) = (int)sVar1;
    break;
  case 4:
    *(size_t *)(s + -0x12) = sVar1;
  }
  return;
}

Assistant:

void sdsupdatelen(sds s) {
    size_t reallen = strlen(s);
    sdssetlen(s, reallen);
}